

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O0

void __thiscall
mp::internal::
AppSolutionHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>::
HandleSolution(AppSolutionHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
               *this,int status,CStringRef message,double *values,double *dual_values,
              double obj_value)

{
  bool bVar1;
  OutputHandler *pOVar2;
  char *pcVar3;
  char *in_RDX;
  BasicSolver *in_RDI;
  NameProvider np_1;
  int num_cons;
  NameProvider np;
  int num_vars;
  MemoryWriter w;
  int wantsol;
  MultiObjTestSolver<2> *solver;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  MockProblemBuilder *in_stack_fffffffffffff780;
  StrFormatSpec<char> *in_stack_fffffffffffff788;
  BasicWriter<char> *in_stack_fffffffffffff790;
  allocator<char> *in_stack_fffffffffffff798;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffff7a0;
  CStringRef in_stack_fffffffffffff7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  size_t in_stack_fffffffffffff7d8;
  NameProvider *in_stack_fffffffffffff7e0;
  CStringRef in_stack_fffffffffffff7e8;
  CStringRef in_stack_fffffffffffff7f0;
  int in_stack_fffffffffffff7fc;
  double *in_stack_fffffffffffff800;
  double in_stack_fffffffffffffa28;
  double *in_stack_fffffffffffffa30;
  double *in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa44;
  SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
  *in_stack_fffffffffffffa48;
  CStringRef in_stack_fffffffffffffa50;
  BasicCStringRef<char> local_588;
  undefined1 local_580 [791];
  BasicMemoryWriter<char,_std::allocator<char>_> local_269;
  uint local_3c;
  MultiObjTestSolver<2> *local_38;
  BasicCStringRef<char> local_8;
  
  local_8.data_ = in_RDX;
  local_38 = SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
             ::solver((SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
                       *)in_RDI);
  local_3c = BasicSolver::wantsol((BasicSolver *)local_38);
  bVar1 = BasicSolver::ampl_flag((BasicSolver *)local_38);
  if ((bVar1) || ((local_3c & 1) != 0)) {
    bVar1 = BasicSolver::ampl_flag((BasicSolver *)local_38);
    if ((bVar1) &&
       ((*(int *)((long)&(in_RDI->super_SolveResultRegistry)._vptr_SolveResultRegistry + 4) != 0 &&
        (pOVar2 = BasicSolver::output_handler((BasicSolver *)local_38),
        (pOVar2->has_output & 1U) == 0)))) {
      in_stack_fffffffffffff7a0 =
           (BasicMemoryWriter<char,_std::allocator<char>_> *)(local_580 + 0x317);
      std::allocator<char>::allocator();
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
                (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      std::allocator<char>::~allocator((allocator<char> *)(local_580 + 0x317));
      fmt::pad<char>((char *)in_stack_fffffffffffff780,
                     (uint)((ulong)in_stack_fffffffffffff778 >> 0x20),
                     (char)((ulong)in_stack_fffffffffffff778 >> 0x18));
      fmt::BasicWriter<char>::operator<<(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
      fmt::BasicCStringRef<char>::BasicCStringRef((BasicCStringRef<char> *)(local_580 + 0x2e0),"{}")
      ;
      local_580._728_8_ =
           fmt::BasicWriter<char>::c_str((BasicWriter<char> *)in_stack_fffffffffffff780);
      BasicSolver::Print<char_const*>
                (in_RDI,in_stack_fffffffffffff7b0,(char **)in_stack_fffffffffffff7a0);
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
                ((BasicMemoryWriter<char,_std::allocator<char>_> *)in_stack_fffffffffffff780);
    }
    local_580._720_8_ = local_8.data_;
    SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>::
    HandleSolution(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa50,
                   in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  }
  bVar1 = BasicSolver::ampl_flag((BasicSolver *)local_38);
  if (!bVar1) {
    if ((local_3c & 8) == 0) {
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)(local_580 + 0x2c8),"{}\n");
      pcVar3 = fmt::BasicCStringRef<char>::c_str(&local_8);
      local_580._704_8_ =
           pcVar3 + *(uint *)((long)&(in_RDI->super_SolveResultRegistry)._vptr_SolveResultRegistry +
                             4);
      BasicSolver::Print<char_const*>
                (in_RDI,in_stack_fffffffffffff7b0,(char **)in_stack_fffffffffffff7a0);
    }
    if ((local_3c & 2) != 0) {
      SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>::
      builder((SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
               *)in_RDI);
      local_580._700_4_ = MockProblemBuilder::num_vars(in_stack_fffffffffffff780);
      SolutionWriterImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::SolFileWriter>::
      stub_abi_cxx11_((SolutionWriterImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::SolFileWriter>
                       *)in_RDI);
      in_stack_fffffffffffff780 = (MockProblemBuilder *)local_580;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (char *)in_stack_fffffffffffff7a0);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)in_stack_fffffffffffff780,in_stack_fffffffffffff778);
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_588,"_svar");
      NameProvider::NameProvider
                (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                 in_stack_fffffffffffff7d8);
      std::__cxx11::string::~string((string *)local_580);
      PrintSolution(in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
                    in_stack_fffffffffffff7f0.data_,in_stack_fffffffffffff7e8.data_,
                    in_stack_fffffffffffff7e0);
      NameProvider::~NameProvider((NameProvider *)in_stack_fffffffffffff780);
    }
    if ((local_3c & 4) != 0) {
      SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>::
      builder((SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
               *)in_RDI);
      MockProblemBuilder::num_algebraic_cons(in_stack_fffffffffffff780);
      SolutionWriterImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::SolFileWriter>::
      stub_abi_cxx11_((SolutionWriterImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::SolFileWriter>
                       *)in_RDI);
      s = &local_848;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (char *)in_stack_fffffffffffff7a0);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)in_stack_fffffffffffff780,s);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xfffffffffffff7b0,"_scon");
      NameProvider::NameProvider
                (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                 in_stack_fffffffffffff7d8);
      std::__cxx11::string::~string((string *)&local_848);
      PrintSolution(in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
                    in_stack_fffffffffffff7f0.data_,in_stack_fffffffffffff7e8.data_,
                    in_stack_fffffffffffff7e0);
      NameProvider::~NameProvider((NameProvider *)in_stack_fffffffffffff780);
    }
  }
  return;
}

Assistant:

void AppSolutionHandlerImpl<Solver, PB, Writer>::HandleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double obj_value) {
  Solver &solver = this->solver();
  int wantsol = solver.wantsol();
  if (solver.ampl_flag() || (wantsol & Solver::WRITE_SOL_FILE) != 0) {
    // "Erase" the banner so that it is not duplicated when printing
    // the solver message.
    if (solver.ampl_flag() && banner_size_ != 0
        && !solver.output_handler()->has_output) {   // #233
      fmt::MemoryWriter w;
      w << fmt::pad("", banner_size_, '\b');
      solver.Print("{}", w.c_str());
    }
    SolutionWriterImpl<Solver, PB, Writer>::HandleSolution(
          status, message, values, dual_values, obj_value);
  }
  if (solver.ampl_flag())
    return;
  if ((wantsol & Solver::SUPPRESS_SOLVER_MSG) == 0)
    solver.Print("{}\n", message.c_str() + banner_size_);
  using internal::PrintSolution;
  if ((wantsol & Solver::PRINT_SOLUTION) != 0) {
    int num_vars = this->builder().num_vars();
    NameProvider np(this->stub() + ".col", "_svar", num_vars);
    PrintSolution(values, num_vars, "variable", "value", np);
  }
  if ((wantsol & Solver::PRINT_DUAL_SOLUTION) != 0) {
    int num_cons = this->builder().num_algebraic_cons();
    NameProvider np(this->stub() + ".row", "_scon", num_cons);
    PrintSolution(dual_values, num_cons, "constraint", "dual value", np);
  }
}